

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::ElementsDecodeRawTransactionRequest::~ElementsDecodeRawTransactionRequest
          (ElementsDecodeRawTransactionRequest *this)

{
  ~ElementsDecodeRawTransactionRequest(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ElementsDecodeRawTransactionRequest() {
    // do nothing
  }